

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

bech32_error bech32_decode(bech32_DecodedResult *decodedResult,char *str)

{
  size_type sVar1;
  unsigned_long __n2;
  bech32_error bVar2;
  DecodedResult localResult;
  string inputStr;
  DecodedResult local_58;
  
  bVar2 = E_BECH32_NULL_ARGUMENT;
  if ((((decodedResult != (bech32_DecodedResult *)0x0) && (decodedResult->hrp != (char *)0x0)) &&
      (str != (char *)0x0)) && (decodedResult->dp != (uchar *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputStr,str,(allocator<char> *)&localResult);
    localResult.hrp._M_dataplus._M_p = (pointer)&localResult.hrp.field_2;
    localResult.hrp._M_string_length = 0;
    localResult.hrp.field_2._M_local_buf[0] = '\0';
    localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bech32::decode(&local_58,&inputStr);
    bech32::DecodedResult::operator=(&localResult,&local_58);
    bech32::DecodedResult::~DecodedResult(&local_58);
    if ((localResult.hrp._M_string_length == 0) &&
       (localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      bVar2 = E_BECH32_INVALID_CHECKSUM;
    }
    else {
      bVar2 = E_BECH32_LENGTH_TOO_SHORT;
      if ((localResult.hrp._M_string_length <= decodedResult->hrplen) &&
         ((ulong)((long)localResult.dp.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)localResult.dp.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= decodedResult->dplen)) {
        decodedResult->encoding = localResult.encoding;
        if (localResult.hrp._M_string_length == 0) {
          sVar1 = 0;
        }
        else {
          memmove(decodedResult->hrp,localResult.hrp._M_dataplus._M_p,
                  localResult.hrp._M_string_length);
          sVar1 = localResult.hrp._M_string_length;
        }
        decodedResult->hrp[sVar1] = '\0';
        bVar2 = E_BECH32_SUCCESS;
        if ((long)localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          memmove(decodedResult->dp,
                  localResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)localResult.dp.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)localResult.dp.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
          bVar2 = E_BECH32_SUCCESS;
        }
      }
    }
    bech32::DecodedResult::~DecodedResult(&localResult);
    std::__cxx11::string::~string((string *)&inputStr);
  }
  return bVar2;
}

Assistant:

bech32_error bech32_decode(bech32_DecodedResult *decodedResult, char const *str) {

    if(decodedResult == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(str == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string inputStr(str);

    bech32::DecodedResult localResult;
    try {
        localResult = bech32::decode(inputStr);
    } catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }

    if(localResult.hrp.empty() && localResult.dp.empty())
        return E_BECH32_INVALID_CHECKSUM;

    if(localResult.hrp.size() > decodedResult->hrplen)
        return E_BECH32_LENGTH_TOO_SHORT;
    if(localResult.dp.size() > decodedResult->dplen)
        return E_BECH32_LENGTH_TOO_SHORT;

    decodedResult->encoding = static_cast<bech32_encoding>(localResult.encoding);
    std::copy_n(localResult.hrp.begin(), localResult.hrp.size(), decodedResult->hrp);
    decodedResult->hrp[localResult.hrp.size()] = '\0';
    std::copy_n(localResult.dp.begin(), localResult.dp.size(), decodedResult->dp);

    return E_BECH32_SUCCESS;
}